

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::removeField(FieldMap *this,int tag)

{
  bool bVar1;
  const_iterator local_30;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_28;
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_20;
  iterator field;
  int tag_local;
  FieldMap *this_local;
  
  field._M_current._4_4_ = tag;
  local_20._M_current = (FieldBase *)findTag(this,tag);
  local_28._M_current =
       (FieldBase *)
       std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end(&this->m_fields);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>
    ::__normal_iterator<FIX::FieldBase*>
              ((__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>
                *)&local_30,&local_20);
    std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::erase(&this->m_fields,local_30);
    removeGroup(this,field._M_current._4_4_);
  }
  return;
}

Assistant:

void FieldMap::removeField(int tag) {
  Fields::iterator field = findTag(tag);
  if (field != m_fields.end()) {
    m_fields.erase(field);
    removeGroup(tag);
  }
}